

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O0

void __thiscall OpenMesh::PropertyT<char>::clear(PropertyT<char> *this)

{
  vector<char,_std::allocator<char>_> local_28;
  PropertyT<char> *local_10;
  PropertyT<char> *this_local;
  
  local_10 = this;
  std::vector<char,_std::allocator<char>_>::clear(&this->data_);
  memset(&local_28,0,0x18);
  std::vector<char,_std::allocator<char>_>::vector(&local_28);
  std::vector<char,_std::allocator<char>_>::swap(&local_28,&this->data_);
  std::vector<char,_std::allocator<char>_>::~vector(&local_28);
  return;
}

Assistant:

virtual void clear()  { data_.clear(); vector_type().swap(data_);    }